

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

void __thiscall
jsonnet::internal::Index::Index
          (Index *this,LocationRange *lr,Fodder *open_fodder,AST *target,Fodder *dot_fodder,
          Fodder *id_fodder,Identifier *id)

{
  AST::AST(&this->super_AST,lr,AST_INDEX,open_fodder);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__Index_0029b158;
  this->target = target;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->dotFodder,dot_fodder);
  this->isSlice = false;
  this->index = (AST *)0x0;
  (this->endColonFodder).
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->endColonFodder).
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endColonFodder).
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->end = (AST *)0x0;
  (this->stepColonFodder).
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stepColonFodder).
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stepColonFodder).
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->step = (AST *)0x0;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->idFodder,id_fodder);
  this->id = id;
  return;
}

Assistant:

Index(const LocationRange &lr, const Fodder &open_fodder, AST *target, const Fodder &dot_fodder,
          const Fodder &id_fodder, const Identifier *id)
        : AST(lr, AST_INDEX, open_fodder),
          target(target),
          dotFodder(dot_fodder),
          isSlice(false),
          index(nullptr),
          end(nullptr),
          step(nullptr),
          idFodder(id_fodder),
          id(id)
    {
    }